

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O2

void __thiscall
absl::lts_20250127::log_internal::LogMessage::OstreamView::~OstreamView(OstreamView *this)

{
  Span<char> *pSVar1;
  Span<char> *pSVar2;
  Span<char> *in_RCX;
  size_type sVar3;
  Span<char> msg;
  Span<char> msg_00;
  
  std::ios::rdbuf((streambuf *)
                  (&this->data_->manipulated + *(long *)(*(long *)&this->data_->manipulated + -0x18)
                  ));
  if ((this->string_start_).ptr_ == (pointer)0x0) {
    pSVar2 = LogMessageData::encoded_remaining(this->data_);
    pSVar1 = LogMessageData::encoded_remaining(this->data_);
    Span<char>::remove_suffix(pSVar2,pSVar1->len_);
  }
  else {
    sVar3 = *(long *)&this->field_0x28 - *(long *)&this->field_0x20;
    if (sVar3 != 0) {
      pSVar2 = &this->encoded_remaining_copy_;
      Span<char>::remove_prefix(pSVar2,sVar3);
      msg.len_ = (size_type)pSVar2;
      msg.ptr_ = (pointer)(this->string_start_).len_;
      EncodeMessageLength((log_internal *)(this->string_start_).ptr_,msg,in_RCX);
      msg_00.len_ = (size_type)pSVar2;
      msg_00.ptr_ = (pointer)(this->message_start_).len_;
      EncodeMessageLength((log_internal *)(this->message_start_).ptr_,msg_00,in_RCX);
      pSVar1 = LogMessageData::encoded_remaining(this->data_);
      sVar3 = (this->encoded_remaining_copy_).len_;
      pSVar1->ptr_ = pSVar2->ptr_;
      pSVar1->len_ = sVar3;
    }
  }
  std::streambuf::~streambuf(this);
  return;
}

Assistant:

LogMessage::OstreamView::~OstreamView() {
  data_.manipulated.rdbuf(nullptr);
  if (!string_start_.data()) {
    // The second field header didn't fit.  Whether the first one did or not, we
    // shouldn't commit `encoded_remaining_copy_`, and we also need to zero the
    // size of `data_->encoded_remaining()` so that no more data are encoded.
    data_.encoded_remaining().remove_suffix(data_.encoded_remaining().size());
    return;
  }
  const absl::Span<const char> contents(pbase(),
                                        static_cast<size_t>(pptr() - pbase()));
  if (contents.empty()) return;
  encoded_remaining_copy_.remove_prefix(contents.size());
  EncodeMessageLength(string_start_, &encoded_remaining_copy_);
  EncodeMessageLength(message_start_, &encoded_remaining_copy_);
  data_.encoded_remaining() = encoded_remaining_copy_;
}